

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

char * google::GetHex(char *start,char *end,uint64_t *hex)

{
  uint uVar1;
  ulong local_40;
  char *pcStack_28;
  int ch;
  char *p;
  uint64_t *hex_local;
  char *end_local;
  char *start_local;
  
  *hex = 0;
  for (pcStack_28 = start;
      (pcStack_28 < end &&
      ((((uVar1 = (uint)*pcStack_28, 0x2f < (int)uVar1 && ((int)uVar1 < 0x3a)) ||
        ((0x40 < (int)uVar1 && ((int)uVar1 < 0x47)))) ||
       ((0x60 < (int)uVar1 && ((int)uVar1 < 0x67)))))); pcStack_28 = pcStack_28 + 1) {
    if ((int)uVar1 < 0x41) {
      local_40 = (ulong)(int)(uVar1 - 0x30);
    }
    else {
      local_40 = (ulong)((uVar1 & 0xf) + 9);
    }
    *hex = *hex << 4 | local_40;
  }
  if (end < pcStack_28) {
    abort();
  }
  return pcStack_28;
}

Assistant:

static char* GetHex(const char* start, const char* end, uint64_t* hex) {
  *hex = 0;
  const char* p;
  for (p = start; p < end; ++p) {
    int ch = *p;
    if ((ch >= '0' && ch <= '9') || (ch >= 'A' && ch <= 'F') ||
        (ch >= 'a' && ch <= 'f')) {
      *hex = (*hex << 4U) |
             (ch < 'A' ? static_cast<uint64_t>(ch - '0') : (ch & 0xF) + 9U);
    } else {  // Encountered the first non-hex character.
      break;
    }
  }
  GLOG_SAFE_ASSERT(p <= end);
  return const_cast<char*>(p);
}